

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_shape_fitting.hpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
eos::fitting::fit_shape_to_landmarks_linear
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PcaModel *shape_model,
          Matrix<float,_3,_4,_0,_3,_4> *affine_camera_matrix,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *landmarks,vector<int,_std::allocator<int>_> *vertex_ids,VectorXf *base_face,float lambda,
          optional<int> num_coefficients_to_fit,optional<float> detector_standard_deviation,
          optional<float> model_standard_deviation)

{
  float *pfVar1;
  float fVar2;
  pointer piVar3;
  int iVar4;
  undefined8 uVar5;
  vector<float,std::allocator<float>> *this;
  VectorXf *pVVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  float *pfVar12;
  Triplet<float,_int> *pTVar13;
  long lVar14;
  ActualDstType actualDst;
  long lVar15;
  Triplet<float,_int> *pTVar16;
  int x;
  uint uVar17;
  LhsNested rows;
  double dVar18;
  double dVar19;
  vector<Eigen::Triplet<float,_int>,_std::allocator<Eigen::Triplet<float,_int>_>_> P_coefficients;
  MatrixXf A;
  VectorXf v_bar;
  VectorXf y;
  MatrixXf V_hat_h;
  VectorXf c_s;
  VectorXf Omega;
  MatrixXf AtOmegaAReg;
  SparseMatrix<float,_0,_int> P;
  MatrixXf rhs;
  DenseStorage<float,__1,__1,__1,_0> local_268;
  undefined1 local_248 [8];
  LhsNested pSStack_240;
  Triplet<float,_int> *local_238;
  long local_230;
  float local_224;
  undefined1 local_220 [48];
  Triplet<float,_int> *local_1f0;
  void *local_1e8;
  assign_op<float,_float> *local_1e0;
  Matrix<float,__1,__1,_0,__1,__1> local_1d8;
  undefined1 local_1c0 [8];
  undefined8 local_1b8;
  variable_if_dynamic<long,__1> local_1b0;
  XprTypeNested local_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  variable_if_dynamic<long,__1> local_198;
  Triplet<float,_int> *local_190;
  Triplet<float,_int> *local_188;
  Triplet<float,_int> *local_180;
  void *local_178;
  void *local_168;
  void *local_158;
  float *local_128;
  long local_120;
  void *local_118;
  Triplet<float,_int> *local_110;
  LhsNested local_108;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  *local_100;
  Triplet<float,_int> *local_f8;
  vector<float,std::allocator<float>> *local_f0;
  VectorXf *local_e8;
  ulong local_e0;
  float *local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  void *local_b8 [3];
  SparseMatrix<float,_0,_int> local_a0;
  void *local_58 [3];
  SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *local_40;
  MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *local_38;
  
  lVar15 = (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(landmarks->
                 super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_224 = lambda;
  local_220._32_8_ = vertex_ids;
  local_d8 = (float *)affine_camera_matrix;
  if (lVar15 != (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) {
    __assert_fail("landmarks.size() == vertex_ids.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/linear_shape_fitting.hpp"
                  ,0x44,
                  "std::vector<float> eos::fitting::fit_shape_to_landmarks_linear(const morphablemodel::PcaModel &, Eigen::Matrix<float, 3, 4>, const std::vector<Eigen::Vector2f> &, const std::vector<int> &, Eigen::VectorXf, float, cpp17::optional<int>, cpp17::optional<float>, cpp17::optional<float>)"
                 );
  }
  if (((ulong)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         (_Optional_base<int,_true,_true>)
         (shape_model->rescaled_pca_basis).
         super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  }
  local_100 = landmarks;
  local_f0 = (vector<float,std::allocator<float>> *)__return_storage_ptr__;
  if ((base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      0) {
    pfVar12 = (shape_model->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar8 = (shape_model->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if (uVar8 == 0) {
      pfVar7 = (base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar9 = 0;
    }
    else {
      if ((long)uVar8 < 0) {
        pcVar10 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
        ;
        goto LAB_0010d382;
      }
      Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)base_face,uVar8,uVar8,1);
      if ((base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != uVar8) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                     );
      }
      pfVar7 = (base_face->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar9 = uVar8 & 0x7ffffffffffffffc;
      if (3 < uVar8) {
        uVar11 = 0;
        do {
          pfVar1 = pfVar12 + uVar11;
          uVar5 = *(undefined8 *)(pfVar1 + 2);
          *(undefined8 *)(pfVar7 + uVar11) = *(undefined8 *)pfVar1;
          *(undefined8 *)(pfVar7 + uVar11 + 2) = uVar5;
          uVar11 = uVar11 + 4;
        } while (uVar11 < uVar9);
      }
    }
    if ((long)uVar9 < (long)uVar8) {
      do {
        pfVar7[uVar9] = pfVar12[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  uVar17 = (uint)lVar15;
  local_220._24_8_ = SEXT48((int)(uVar17 * 4));
  pTVar13 = (Triplet<float,_int> *)
            (long)num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_payload;
  local_1b0.m_value = local_1b0.m_value & 0xffffffff00000000;
  local_1c0 = (undefined1  [8])local_220._24_8_;
  local_1b8 = (long)pTVar13;
  local_e8 = base_face;
  if ((int)(num_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload | uVar17 * 4) < 0) {
    pcVar10 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_1d8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                *)local_1c0);
    local_230 = lVar15;
    if (0 < (int)uVar17) {
      lVar15 = 0;
      pTVar16 = (Triplet<float,_int> *)0x0;
      do {
        morphablemodel::PcaModel::get_rescaled_pca_basis_at_point
                  ((MatrixXf *)&local_268,shape_model,
                   *(int *)((long)&pTVar16->m_row +
                           (long)(((_Vector_base<int,_std::allocator<int>_> *)local_220._32_8_)->
                                 _M_impl).super__Vector_impl_data._M_start));
        if ((long)(local_268.m_rows | (ulong)pTVar13) < 0 &&
            (LhsNested)local_268.m_data != (LhsNested)0x0) {
          pcVar10 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
LAB_0010d287:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,pcVar10);
        }
        if (((long)(local_268.m_rows | (ulong)pTVar13) < 0) || (local_268.m_cols < (long)pTVar13)) {
          pcVar10 = 
          "Eigen::Block<const Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
LAB_0010d2a6:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                        ,0x93,pcVar10);
        }
        local_1c0 = (undefined1  [8])
                    ((long)local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data + lVar15);
        local_1b8 = 3;
        local_1b0.m_value =
             local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        if (local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0 &&
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_data != (float *)0x0) {
          pcVar10 = 
          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>, Level = 0]"
          ;
          goto LAB_0010d287;
        }
        local_1a8 = &local_1d8;
        local_198.m_value = 0;
        local_190 = (Triplet<float,_int> *)
                    local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
        local_1a0.m_value = (long)pTVar16;
        if ((local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols < 0) ||
           (local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows + 0xfffffffffffffff4U + 9U < (long)pTVar16)) {
          pcVar10 = 
          "Eigen::Block<Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
          ;
          goto LAB_0010d2a6;
        }
        local_248 = (undefined1  [8])local_268.m_data;
        local_238 = (Triplet<float,_int> *)local_268.m_rows;
        if (((Triplet<float,_int> *)local_268.m_rows != (Triplet<float,_int> *)0x3) ||
           ((Triplet<float,_int> *)
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != pTVar13)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseBase.h"
                        ,0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        local_220._16_8_ =
             local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_a0._0_8_ = local_220;
        local_a0.m_outerSize = (Index)local_248;
        local_a0.m_innerSize = (Index)local_b8;
        local_a0.m_outerIndex = (StorageIndex *)local_1c0;
        local_220._0_8_ = local_1c0;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)&local_a0);
        pTVar16 = (Triplet<float,_int> *)&pTVar16->m_col;
        free(local_268.m_data);
        lVar15 = lVar15 + 0x10;
      } while ((Triplet<float,_int> *)((ulong)(uVar17 & 0x7fffffff) << 2) != pTVar16);
    }
    lVar15 = local_230;
    rows = (LhsNested)((local_230 << 0x20) * 3 >> 0x20);
    local_a0._0_8_ = local_a0._0_8_ & 0xffffffffffffff00;
    local_a0.m_outerSize = 0;
    local_a0.m_innerSize = 0;
    local_a0.m_outerIndex = (StorageIndex *)0x0;
    local_a0.m_innerNonZeros = (StorageIndex *)0x0;
    local_a0.m_data.m_values = (Scalar *)0x0;
    local_a0.m_data.m_indices = (StorageIndex *)0x0;
    local_a0.m_data.m_size = 0;
    local_a0.m_data.m_allocatedSize = 0;
    local_f8 = pTVar13;
    Eigen::SparseMatrix<float,_0,_int>::resize(&local_a0,(Index)rows,local_220._24_8_);
    local_248 = (undefined1  [8])0x0;
    pSStack_240 = (LhsNested)0x0;
    local_238 = (Triplet<float,_int> *)0x0;
    if (0 < (int)(uint)lVar15) {
      local_e0 = (ulong)((uint)lVar15 & 0x7fffffff);
      uVar9 = 0;
      uVar8 = 0;
      local_108 = rows;
      do {
        local_c0 = uVar9 * 3;
        lVar15 = 0;
        pfVar12 = local_d8;
        local_d0 = uVar9;
        local_c8 = uVar8;
        do {
          iVar4 = (int)local_c0;
          lVar14 = -0x30;
          uVar8 = local_c8 & 0xffffffff;
          do {
            local_1c0._4_4_ = (int)uVar8;
            local_1c0._0_4_ = iVar4 + (int)lVar15;
            fVar2 = *(float *)((long)pfVar12 + lVar14 + 0x30);
            local_1b8._0_4_ = fVar2;
            if (pSStack_240 == (LhsNested)local_238) {
              std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>::
              _M_realloc_insert<Eigen::Triplet<float,int>>
                        ((vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>
                          *)local_248,(iterator)pSStack_240,(Triplet<float,_int> *)local_1c0);
            }
            else {
              *(float *)&pSStack_240->m_outerSize = fVar2;
              pSStack_240->super_SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_> =
                   local_1c0;
              pSStack_240 = (LhsNested)((long)pSStack_240 + 0xc);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            lVar14 = lVar14 + 0xc;
          } while (lVar14 != 0);
          lVar15 = lVar15 + 1;
          pfVar12 = pfVar12 + 1;
        } while (lVar15 != 3);
        uVar9 = local_d0 + 1;
        uVar8 = (ulong)((int)local_c8 + 4);
        rows = local_108;
      } while (uVar9 != local_e0);
    }
    local_220._0_8_ = pSStack_240;
    local_1c0 = local_248;
    Eigen::internal::
    set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<float,int>*,std::vector<Eigen::Triplet<float,int>,std::allocator<Eigen::Triplet<float,int>>>>,Eigen::SparseMatrix<float,0,int>,Eigen::internal::scalar_sum_op<float,float>>
              (local_1c0,local_220,&local_a0,&local_268);
    pVVar6 = local_e8;
    lVar15 = local_230;
    if (((ulong)detector_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) == 0) {
      dVar18 = 1.7320507764816284;
    }
    else {
      dVar18 = (double)detector_standard_deviation.super__Optional_base<float,_true,_true>.
                       _M_payload.super__Optional_payload_base<float>._M_payload._M_value;
    }
    dVar19 = 0.0;
    if (((ulong)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> & 0x100000000) != 0) {
      dVar19 = (double)model_standard_deviation.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
    }
    local_1b8._4_4_ = 1.0 / (float)(dVar18 * dVar18 + dVar19 * dVar19);
    local_1c0 = (undefined1  [8])rows;
    if (-1 < (long)rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_118,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_1c0);
      local_1b8._4_4_ = 1.0;
      local_1c0 = (undefined1  [8])rows;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_1e8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_1c0);
      uVar17 = (uint)lVar15;
      if (0 < (int)uVar17) {
        pfVar12 = (float *)((long)&(((local_100->
                                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).
                                   m_storage.m_data + 4);
        lVar15 = 0;
        do {
          if (((long)local_1e0 <= lVar15) ||
             (*(float *)((long)local_1e8 + lVar15 * 4) =
                   ((plain_array<float,_2,_0,_0> *)(pfVar12 + -1))->array[0],
             local_1e0 <= (assign_op<float,_float> *)(lVar15 + 1U))) goto LAB_0010d225;
          *(float *)((long)local_1e8 + lVar15 * 4 + 4) = *pfVar12;
          lVar15 = lVar15 + 3;
          pfVar12 = pfVar12 + 2;
        } while ((ulong)(uVar17 & 0x7fffffff) * 3 != lVar15);
      }
      local_1c0 = (undefined1  [8])local_220._24_8_;
      local_1b8._4_4_ = 1.0;
      if (-1 < (int)uVar17) {
        pTVar13 = (Triplet<float,_int> *)(local_220 + 0x28);
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)pTVar13,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)local_1c0);
        if (uVar17 != 0) {
          piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)local_220._32_8_)->_M_impl).
                   super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            lVar14 = (long)*(int *)((long)piVar3 + lVar15);
            if (lVar14 < 0) {
LAB_0010d225:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<float, -1, 1>, Level = 1]"
                           );
            }
            uVar8 = (pVVar6->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows;
            if (((long)uVar8 <= lVar14 * 3) || ((long)local_1f0 <= lVar15)) goto LAB_0010d225;
            pfVar12 = (pVVar6->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            *(float *)(local_220._40_8_ + lVar15 * 4) = pfVar12[lVar14 * 3];
            iVar4 = (int)(lVar14 * 3);
            uVar9 = (ulong)(iVar4 + 1);
            if ((uVar8 <= uVar9) || (local_1f0 <= (Triplet<float,_int> *)(lVar15 + 1U)))
            goto LAB_0010d225;
            *(float *)(local_220._40_8_ + (lVar15 + 1) * 4) = pfVar12[uVar9];
            uVar9 = (ulong)(iVar4 + 2);
            if ((uVar8 <= uVar9) || (local_1f0 <= (Triplet<float,_int> *)(lVar15 + 2U)))
            goto LAB_0010d225;
            *(float *)(local_220._40_8_ + (lVar15 + 2) * 4) = pfVar12[uVar9];
            lVar15 = lVar15 + 4;
          } while ((ulong)(uVar17 & 0x7fffffff) << 2 != lVar15);
        }
        if (local_a0.m_outerSize ==
            local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          local_1b8 = (long)&local_1d8;
          local_1c0 = (undefined1  [8])&local_a0;
          Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                    ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_220,
                     (DenseBase<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                      *)local_1c0);
          pTVar16 = local_f8;
          if ((Triplet<float,_int> *)local_a0.m_outerSize == local_1f0) {
            local_1b8 = (long)pTVar13;
            local_1b0.m_value = (long)&local_1e8;
            if ((assign_op<float,_float> *)local_a0.m_innerSize != local_1e0) {
              pcVar10 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Matrix<float, -1, 1>]"
              ;
              local_1c0 = (undefined1  [8])&local_a0;
LAB_0010d3d7:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x74,pcVar10);
            }
            local_268.m_data = (float *)0x0;
            local_268.m_rows = 0;
            local_268.m_cols = 0;
            if (local_a0.m_innerSize < 0) {
              pcVar10 = 
              "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
              ;
              local_1c0 = (undefined1  [8])&local_a0;
LAB_0010d382:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                            ,0x115,pcVar10);
            }
            local_1c0 = (undefined1  [8])&local_a0;
            Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize
                      (&local_268,local_a0.m_innerSize,local_a0.m_innerSize,1);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>,Eigen::internal::assign_op<float,float>>
                      ((Matrix<float,__1,__1,_0,__1,__1> *)&local_268,
                       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                        *)local_1c0,(assign_op<float,_float> *)local_b8);
            if ((Triplet<float,_int> *)local_220._8_8_ == local_110) {
              if ((long)pTVar16 < 0) {
                pcVar10 = 
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                ;
                goto LAB_0010d3b8;
              }
              local_1a0.m_value = (long)pTVar16;
              local_198.m_value = (long)pTVar16;
              local_190 = (Triplet<float,_int> *)CONCAT44(local_190._4_4_,local_224);
              local_188 = pTVar16;
              local_180 = pTVar16;
              local_1c0 = (undefined1  [8])local_220;
              local_1b8 = (long)&local_118;
              local_1b0.m_value = (long)local_220;
              if ((Triplet<float,_int> *)local_220._16_8_ != pTVar16) {
                pcVar10 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>]"
                ;
                goto LAB_0010d3d7;
              }
              Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>const>const>>
                        ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_b8,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
                          *)local_1c0);
              if ((Triplet<float,_int> *)local_220._8_8_ == local_110) {
                local_1b0.m_value = (long)&local_118;
                if (local_220._8_8_ == local_268.m_rows) {
                  local_1c0 = (undefined1  [8])local_220;
                  local_1a8 = (XprTypeNested)&local_268;
                  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
                  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_58,
                             (DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                              *)local_1c0);
                  this = local_f0;
                  Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
                  ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                            ((ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_1c0,
                             (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_b8);
                  Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>>
                  ::
                  _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                              *)local_1c0,
                             (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_58);
                  local_40 = (SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                              *)local_1c0;
                  local_38 = (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_58;
                  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
                  PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_128,
                             (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                              *)&local_40);
                  free(local_158);
                  free(local_168);
                  free(local_178);
                  free(local_188);
                  free((void *)local_198.m_value);
                  free(local_1a8);
                  free((void *)local_1c0);
                  std::vector<float,std::allocator<float>>::vector<float_const*,void>
                            (this,local_128,local_128 + local_120,(allocator_type *)local_1c0);
                  free(local_128);
                  free(local_58[0]);
                  free(local_b8[0]);
                  free(local_268.m_data);
                  free((void *)local_220._0_8_);
                  free((void *)local_220._40_8_);
                  free(local_1e8);
                  free(local_118);
                  if (local_248 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_248,(long)local_238 - (long)local_248);
                  }
                  free(local_a0.m_outerIndex);
                  free(local_a0.m_innerNonZeros);
                  Eigen::internal::CompressedStorage<float,_int>::~CompressedStorage
                            (&local_a0.m_data);
                  free(local_1d8.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data);
                  return (vector<float,_std::allocator<float>_> *)this;
                }
                pcVar10 = 
                "Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
                ;
                local_1c0 = (undefined1  [8])local_220;
                local_1a8 = (XprTypeNested)&local_268;
              }
              else {
                pcVar10 = 
                "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, Option = 1]"
                ;
              }
            }
            else {
              pcVar10 = 
              "Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, Option = 1]"
              ;
            }
          }
          else {
            pcVar10 = 
            "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
            ;
          }
        }
        else {
          pcVar10 = 
          "Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<float>, _Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
          ;
        }
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                      ,0x62,pcVar10);
      }
    }
    pcVar10 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
    ;
  }
LAB_0010d3b8:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,pcVar10);
}

Assistant:

inline std::vector<float> fit_shape_to_landmarks_linear(
    const morphablemodel::PcaModel& shape_model, Eigen::Matrix<float, 3, 4> affine_camera_matrix,
    const std::vector<Eigen::Vector2f>& landmarks, const std::vector<int>& vertex_ids,
    Eigen::VectorXf base_face = Eigen::VectorXf(), float lambda = 3.0f,
    cpp17::optional<int> num_coefficients_to_fit = cpp17::optional<int>(),
    cpp17::optional<float> detector_standard_deviation = cpp17::optional<float>(),
    cpp17::optional<float> model_standard_deviation = cpp17::optional<float>())
{
    assert(landmarks.size() == vertex_ids.size());

    using Eigen::VectorXf;
    using Eigen::MatrixXf;

    const int num_coeffs_to_fit = num_coefficients_to_fit.value_or(shape_model.get_num_principal_components());
    const int num_landmarks = static_cast<int>(landmarks.size());

    if (base_face.size() == 0)
    {
        base_face = shape_model.get_mean();
    }

    // $\hat{V} \in R^{3N\times m-1}$, subselect the rows of the eigenvector matrix $V$ associated with the $N$ feature points
    // And we insert a row of zeros after every third row, resulting in matrix $\hat{V}_h \in R^{4N\times m-1}$:
    MatrixXf V_hat_h = MatrixXf::Zero(4 * num_landmarks, num_coeffs_to_fit);
    int row_index = 0;
    for (int i = 0; i < num_landmarks; ++i)
    {
        // In the paper, I'm not sure whether they use the orthonormal basis. It seems a bit messy/inconsistent even in the paper.
        // Update PH 26.5.2014: I think the rescaled basis is fine/better!
        const auto& basis_rows = shape_model.get_rescaled_pca_basis_at_point(vertex_ids[i]);
        V_hat_h.block(row_index, 0, 3, V_hat_h.cols()) =
            basis_rows.block(0, 0, basis_rows.rows(), num_coeffs_to_fit);
        row_index += 4; // replace 3 rows and skip the 4th one, it has all zeros
    }

    // Form a block diagonal matrix $P \in R^{3N\times 4N}$ in which the camera matrix C (P_Affine, affine_camera_matrix) is placed on the diagonal:
    Eigen::SparseMatrix<float> P(3 * num_landmarks, 4 * num_landmarks);
    std::vector<Eigen::Triplet<float>> P_coefficients; // list of non-zeros coefficients
    for (int i = 0; i < num_landmarks; ++i) { // Note: could make this the inner-most loop.
        for (int x = 0; x < affine_camera_matrix.rows(); ++x) {
            for (int y = 0; y < affine_camera_matrix.cols(); ++y) {
                P_coefficients.push_back(
                    Eigen::Triplet<float>(3 * i + x, 4 * i + y, affine_camera_matrix(x, y)));
            }
        }
    }
    P.setFromTriplets(P_coefficients.begin(), P_coefficients.end());

    // The variances: Add the 2D and 3D standard deviations.
    // If the user doesn't provide them, we choose the following:
    // 2D (detector) standard deviation: In pixel, we follow [1] and choose sqrt(3) as the default value.
    // 3D (model) variance: 0.0f. It only makes sense to set it to something when we have a different variance
    // for different vertices.
    // The 3D variance has to be projected to 2D (for details, see paper [1]) so the units do match up.
    const float sigma_squared_2D = std::pow(detector_standard_deviation.value_or(std::sqrt(3.0f)), 2) +
                                   std::pow(model_standard_deviation.value_or(0.0f), 2);
    // We use a VectorXf, and later use .asDiagonal():
    const VectorXf Omega = VectorXf::Constant(3 * num_landmarks, 1.0f / sigma_squared_2D);
    // Earlier, we set Sigma in a for-loop and then computed Omega, but it was really unnecessary:
    // Sigma(i, i) = sqrt(sigma_squared_2D), but then Omega is Sigma.t() * Sigma (squares the diagonal) - so
    // we just assign 1/sigma_squared_2D to Omega here.

    // The landmarks in matrix notation (in homogeneous coordinates), $3N\times 1$
    VectorXf y = VectorXf::Ones(3 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        y(3 * i) = landmarks[i][0];
        y((3 * i) + 1) = landmarks[i][1];
        // y((3 * i) + 2) = 1; // already 1, stays (homogeneous coordinate)
    }

    // The mean, with an added homogeneous coordinate (x_1, y_1, z_1, 1, x_2, ...)^t
    VectorXf v_bar = VectorXf::Ones(4 * num_landmarks);
    for (int i = 0; i < num_landmarks; ++i)
    {
        v_bar(4 * i) = base_face(vertex_ids[i] * 3);
        v_bar((4 * i) + 1) = base_face(vertex_ids[i] * 3 + 1);
        v_bar((4 * i) + 2) = base_face(vertex_ids[i] * 3 + 2);
        // v_bar((4 * i) + 3) = 1; // already 1, stays (homogeneous coordinate)
    }

    // Bring into standard regularised quadratic form with diagonal distance matrix Omega:
    const MatrixXf A = P * V_hat_h; // camera matrix times the basis
    const MatrixXf b = P * v_bar - y; // camera matrix times the mean, minus the landmarks
    const MatrixXf AtOmegaAReg = A.transpose() * Omega.asDiagonal() * A +
                                 lambda * Eigen::MatrixXf::Identity(num_coeffs_to_fit, num_coeffs_to_fit);
    const MatrixXf rhs = -A.transpose() * Omega.asDiagonal() * b; // It's -A^t*Omega^t*b, but we don't need to
                                                                  // transpose Omega, since it's a diagonal
                                                                  // matrix, and Omega^t = Omega.

    // c_s: The 'x' that we solve for. (The variance-normalised shape parameter vector, $c_s =
    // [a_1/sigma_{s,1} , ..., a_m-1/sigma_{s,m-1}]^t$.)
    // We get coefficients ~ N(0, 1), because we're fitting with the rescaled basis. The coefficients are not
    // multiplied with their eigenvalues.
    const VectorXf c_s = AtOmegaAReg.colPivHouseholderQr().solve(rhs);

    return std::vector<float>(c_s.data(), c_s.data() + c_s.size());
}